

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLNode::LastChildElement(XMLNode *this,char *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *p;
  XMLElement *element;
  XMLNode *node;
  char *name_local;
  XMLNode *this_local;
  XMLElement *this_00;
  
  element = (XMLElement *)this->_lastChild;
  do {
    if (element == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    iVar2 = (*(element->super_XMLNode)._vptr_XMLNode[6])();
    this_00 = (XMLElement *)CONCAT44(extraout_var,iVar2);
    if (this_00 != (XMLElement *)0x0) {
      if (name == (char *)0x0) {
        return this_00;
      }
      p = XMLElement::Name(this_00);
      bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
      if (bVar1) {
        return this_00;
      }
    }
    element = (XMLElement *)(element->super_XMLNode)._prev;
  } while( true );
}

Assistant:

const XMLElement* XMLNode::LastChildElement( const char* name ) const
{
    for( const XMLNode* node = _lastChild; node; node = node->_prev ) {
        const XMLElement* element = node->ToElement();
        if ( element ) {
            if ( !name || XMLUtil::StringEqual( element->Name(), name ) ) {
                return element;
            }
        }
    }
    return 0;
}